

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O2

int __thiscall
SOCK5ConnectionMaker::exchange_data(SOCK5ConnectionMaker *this,fd_set *rdfds,fd_set *wrfds)

{
  uchar uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int i;
  int i_1;
  ulong uVar5;
  ulong uVar6;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (this->drop != false) {
    return 0;
  }
  iVar2 = this->client_sock_;
  if ((((ulong)rdfds->fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) == 0) ||
     (this->outputbuf_size != 0)) {
LAB_00104308:
    iVar2 = this->client_sock_;
    if (((ulong)wrfds->fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) == 0) {
      return 0;
    }
    if ((long)this->outputbuf_size == 0) {
      return 0;
    }
    sVar3 = send(iVar2,this->outputbuf,(long)this->outputbuf_size,0);
    this->outputbuf_size = 0;
    if (((int)sVar3 == 0) || (((int)sVar3 == -1 && (piVar4 = __errno_location(), *piVar4 != 0xb))))
    {
      this->drop = true;
    }
    if (this->firstStepCompleted != false) {
      return 1;
    }
    this = (SOCK5ConnectionMaker *)&this->firstStepCompleted;
  }
  else {
    sVar3 = recv(iVar2,this->inputbuf,0x400,0);
    iVar2 = (int)sVar3;
    this->inputbuf_size = iVar2;
    if (iVar2 == 0) {
      iVar2 = 1;
      goto LAB_0010439f;
    }
    if (iVar2 != -1) {
      if ((0 < iVar2) && (this->firstStepCompleted == false)) {
        this->outputbuf_size = 2;
        this->outputbuf[0] = '\x05';
        this->outputbuf[1] = 0xff;
        for (uVar5 = 0; this->inputbuf[1] != uVar5; uVar5 = uVar5 + 1) {
          if (this->inputbuf[uVar5 + 2] == '\0') {
            this->outputbuf[1] = '\0';
          }
        }
        goto LAB_00104308;
      }
LAB_001043f8:
      this->outputbuf_size = 10;
      this->outputbuf[0] = '\x05';
      this->outputbuf[1] = '\0';
      this->outputbuf[2] = '\0';
      this->outputbuf[3] = '\x01';
      this->outputbuf[4] = '\x7f';
      this->outputbuf[5] = '\0';
      this->outputbuf[6] = '\0';
      this->outputbuf[7] = '\x01';
      *(short *)(this->outputbuf + 8) = (short)this->port;
      if (this->inputbuf[0] != '\x05') {
        this->outputbuf[1] = '\a';
      }
      if (this->inputbuf[1] != '\x01') {
        this->outputbuf[1] = '\a';
      }
      uVar1 = this->inputbuf[3];
      if (uVar1 == '\x03') {
        uVar6 = (ulong)this->inputbuf[4];
        this->domain = true;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          std::__cxx11::string::push_back((char)this + '\x18');
        }
        *(uchar *)((long)&this->port + 1) = this->inputbuf[uVar6 + 5];
        *(uchar *)&this->port = this->inputbuf[uVar6 + 6];
        uVar1 = this->inputbuf[3];
      }
      else if (uVar1 == '\x04') {
        this->outputbuf[1] = '\b';
        goto LAB_00104308;
      }
      if (uVar1 == '\x01') {
        this->domain = false;
        std::__cxx11::to_string(&local_50,(uint)this->inputbuf[4]);
        std::operator+(&local_110,&local_50,'.');
        std::__cxx11::to_string(&local_130,(uint)this->inputbuf[5]);
        std::operator+(&local_f0,&local_110,&local_130);
        std::operator+(&local_d0,&local_f0,'.');
        std::__cxx11::to_string(&local_150,(uint)this->inputbuf[6]);
        std::operator+(&local_b0,&local_d0,&local_150);
        std::operator+(&local_90,&local_b0,'.');
        std::__cxx11::to_string(&local_170,(uint)this->inputbuf[7]);
        std::operator+(&local_70,&local_90,&local_170);
        std::__cxx11::string::append((string *)&this->addr);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_50);
        *(ushort *)&this->port =
             *(ushort *)(this->inputbuf + 8) << 8 | *(ushort *)(this->inputbuf + 8) >> 8;
      }
      goto LAB_00104308;
    }
    piVar4 = __errno_location();
    if (*piVar4 == 0xb) goto LAB_001043f8;
  }
  iVar2 = 0;
LAB_0010439f:
  this->drop = true;
  return iVar2;
}

Assistant:

int SOCK5ConnectionMaker::exchange_data(const fd_set &rdfds, const fd_set &wrfds) {
    if (drop) {
        return 0;
    }
    if (FD_ISSET(client_sock_, &rdfds) && outputbuf_size == 0) {
        inputbuf_size = recv(client_sock_, inputbuf, MAX_BUF_SIZE, 0);
        if (inputbuf_size == 0) {
            drop = true;
            return true;
        }
        if (inputbuf_size == -1 && errno != EWOULDBLOCK) {
            drop = true;
            return 0;
        }
        if (!firstStepCompleted && inputbuf_size > 0) {
            outputbuf_size = 2;
            outputbuf[0] = 0x05;
            outputbuf[1] = 0xFF;
            for (int i = 0; i < inputbuf[1]; i++) { //auth methods
                if (inputbuf[i + 2] == 0x00) {
                    outputbuf[1] = 0x00;
                }
            }
        } else {
            outputbuf_size = 10;
            outputbuf[0] = 0x05;
            outputbuf[1] = 0x00;
            outputbuf[2] = 0x00;
            outputbuf[3] = 0x01;
            //writing my ip
            outputbuf[4] = 127;
            outputbuf[5] = 0;
            outputbuf[6] = 0;
            outputbuf[7] = 1;
            //writing my port
            outputbuf[8] = ((unsigned char *) &port)[0];
            outputbuf[9] = ((unsigned char *) &port)[1];
            if (inputbuf[0] != 0x05) { //if SOCK4
                outputbuf[1] = 0x07;
            }
            if (inputbuf[1] != 0x01) { //if operation does'n support
                outputbuf[1] = 0x07;
            }
            if (inputbuf[3] == 0x04) { //if ipv6
                outputbuf[1] = 0x08;
            }
            if (inputbuf[3] == 0x03) { //if domain
                int k = inputbuf[4];
                domain = true;
                for (int i = 0; i < k; i++) {
                    addr.push_back(inputbuf[i + 5]);
                }
                ((unsigned char *) &port)[1] = inputbuf[k + 5];
                ((unsigned char *) &port)[0] = inputbuf[k + 6];
            }
            if (inputbuf[3] == 0x01) {//if ipv4
                domain = false;
                addr += std::to_string(inputbuf[4]) + '.' + std::to_string(inputbuf[5]) + '.' +
                        std::to_string(inputbuf[6]) + '.' + std::to_string(inputbuf[7]);
                ((unsigned char *) &port)[1] = inputbuf[8];
                ((unsigned char *) &port)[0] = inputbuf[9];
            }
        }
    }
    if (FD_ISSET(client_sock_, &wrfds) && outputbuf_size != 0) {
        int err = send(client_sock_, outputbuf, outputbuf_size, 0);
        outputbuf_size = 0;
        if (err == 0 || (err == -1 && errno != EWOULDBLOCK)) {
            drop = true;
        }
        if (!firstStepCompleted) {
            firstStepCompleted = true;
        } else {
            return 1;
        }
    }
    return 0;
}